

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O0

void __thiscall
gss::innards::HomomorphismSearcher::softmax_shuffle
          (HomomorphismSearcher *this,vector<int,_std::allocator<int>_> *branch_v,uint branch_v_end)

{
  longlong lVar1;
  reference __b;
  uint in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  undefined8 *in_RDI;
  uint select_element;
  longlong select_score;
  uniform_int_distribution<long_long> dist;
  uint start;
  uint v;
  longlong total;
  anon_class_4_1_20a59a37 expish;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  HomomorphismModel *in_stack_ffffffffffffff90;
  reference in_stack_ffffffffffffff98;
  int degree;
  anon_class_4_1_20a59a37 *in_stack_ffffffffffffffa0;
  undefined4 local_44;
  undefined8 local_40;
  undefined4 local_28;
  undefined4 local_24;
  
  HomomorphismModel::largest_target_degree((HomomorphismModel *)0x1864b4);
  for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
    std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(ulong)local_24);
    HomomorphismModel::target_degree
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    softmax_shuffle::anon_class_4_1_20a59a37::operator()
              (in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
  local_28 = 0;
  do {
    if (in_EDX <= local_28) {
      return;
    }
    std::uniform_int_distribution<long_long>::uniform_int_distribution
              ((uniform_int_distribution<long_long> *)in_stack_ffffffffffffff90,
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0x18654b);
    local_40 = std::uniform_int_distribution<long_long>::operator()
                         ((uniform_int_distribution<long_long> *)in_stack_ffffffffffffff90,
                          (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                           *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    for (local_44 = local_28; degree = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
        local_44 + 1 < in_EDX; local_44 = local_44 + 1) {
      in_stack_ffffffffffffffa0 = (anon_class_4_1_20a59a37 *)*in_RDI;
      std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(ulong)local_44);
      HomomorphismModel::target_degree
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      lVar1 = softmax_shuffle::anon_class_4_1_20a59a37::operator()
                        (in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      degree = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      local_40 = local_40 - lVar1;
      if (local_40 < 1) break;
    }
    in_stack_ffffffffffffff90 = (HomomorphismModel *)*in_RDI;
    std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(ulong)local_44);
    HomomorphismModel::target_degree
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    softmax_shuffle::anon_class_4_1_20a59a37::operator()(in_stack_ffffffffffffffa0,degree);
    in_stack_ffffffffffffff98 =
         std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(ulong)local_44);
    __b = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(ulong)local_28);
    std::swap<int>(in_stack_ffffffffffffff98,__b);
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

auto HomomorphismSearcher::softmax_shuffle(
    vector<int> & branch_v,
    unsigned branch_v_end) -> void
{
    // repeatedly pick a softmax-biased vertex, move it to the front of branch_v,
    // and then only consider items further to the right in the next iteration.

    // Using floating point here turned out to be way too slow. Fortunately the base
    // of softmax doesn't seem to matter, so we use 2 instead of e, and do everything
    // using bit voodoo.
    auto expish = [largest_target_degree = this->model.largest_target_degree()](int degree) {
        constexpr int sufficient_space_for_adding_up = numeric_limits<long long>::digits - 18;
        auto shift = max<int>(degree - largest_target_degree + sufficient_space_for_adding_up, 0);
        return 1ll << shift;
    };

    long long total = 0;
    for (unsigned v = 0; v < branch_v_end; ++v)
        total += expish(model.target_degree(0, branch_v[v]));

    for (unsigned start = 0; start < branch_v_end; ++start) {
        // pick a random number between 1 and total inclusive
        uniform_int_distribution<long long> dist(1, total);
        long long select_score = dist(global_rand);

        // go over the list until we hit the score
        unsigned select_element = start;
        for (; select_element + 1 < branch_v_end; ++select_element) {
            select_score -= expish(model.target_degree(0, branch_v[select_element]));
            if (select_score <= 0)
                break;
        }

        // move to front
        total -= expish(model.target_degree(0, branch_v[select_element]));
        swap(branch_v[select_element], branch_v[start]);
    }
}